

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O2

void __thiscall
amrex::PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
          (PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *this,size_type a_new_size)

{
  size_type a_capacity;
  size_type a_num_to_be_added;
  
  a_num_to_be_added = a_new_size - this->m_capacity;
  if (this->m_capacity <= a_new_size && a_num_to_be_added != 0) {
    a_capacity = GetNewCapacity(this,a_num_to_be_added);
    AllocateBuffer(this,a_capacity);
  }
  this->m_size = a_new_size;
  return;
}

Assistant:

void resize (size_type a_new_size) noexcept
        {
            if (capacity() < a_new_size) AllocateBuffer(GetNewCapacity(a_new_size - capacity()));
            m_size = a_new_size;
        }